

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int UpdateLastProcessedPos(BrotliEncoderState *s)

{
  ulong uVar1;
  uint32_t result;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = s->last_processed_pos_;
  if (2 < uVar2 >> 0x1e) {
    uVar2 = (ulong)(((uint)uVar2 & 0x3fffffff) + ((int)((uint)uVar2 * 2) >> 1 & 0xc0000000U) +
                   0x80000000);
  }
  uVar1 = s->input_pos_;
  uVar3 = (uint)uVar1;
  if (0xbfffffff < uVar1) {
    uVar3 = ((int)(uVar3 * 2) >> 1 & 0xc0000000U) + (uVar3 & 0x3fffffff) + 0x80000000;
  }
  s->last_processed_pos_ = uVar1;
  return (int)(uVar3 < (uint)uVar2);
}

Assistant:

static BROTLI_BOOL UpdateLastProcessedPos(BrotliEncoderState* s) {
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint32_t wrapped_input_pos = WrapPosition(s->input_pos_);
  s->last_processed_pos_ = s->input_pos_;
  return TO_BROTLI_BOOL(wrapped_input_pos < wrapped_last_processed_pos);
}